

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O0

CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
          (CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other)

{
  long lVar1;
  long lVar2;
  DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this_00;
  Index startCol;
  EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other_00;
  Index IVar3;
  Index IVar4;
  Index blockCols;
  Type local_50;
  EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_18;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other_local;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_local;
  
  lVar1 = *(long *)(this + 0x10);
  local_18 = (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)other;
  other_local = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this;
  IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    (*(PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> **)this);
  if ((lVar1 == IVar3) &&
     ((IVar4 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(local_18), IVar4 != 0 ||
      (IVar4 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(local_18),
      IVar4 != *(long *)(this + 0x18))))) {
    *(long *)(this + 8) = *(long *)(this + 0x18) + *(long *)(this + 8);
    *(undefined8 *)(this + 0x10) = 0;
    IVar4 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(local_18);
    *(Index *)(this + 0x18) = IVar4;
    lVar1 = *(long *)(this + 8);
    lVar2 = *(long *)(this + 0x18);
    IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      (*(PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> **)this);
    if (IVar3 < lVar1 + lVar2) {
      __assert_fail("m_row+m_currentBlockRows<=m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/CommaInitializer.h"
                    ,0x59,
                    "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::operator,(const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
  }
  lVar1 = *(long *)(this + 0x10);
  IVar4 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(local_18);
  IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    (*(PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> **)this);
  if (lVar1 + IVar4 <= IVar3) {
    lVar1 = *(long *)(this + 0x18);
    IVar4 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(local_18);
    other_00 = local_18;
    if (lVar1 == IVar4) {
      this_00 = *(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> **)this;
      IVar3 = *(Index *)(this + 8);
      startCol = *(Index *)(this + 0x10);
      IVar4 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(local_18);
      blockCols = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(local_18);
      DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<_1,_1>
                (&local_50,this_00,IVar3,startCol,IVar4,blockCols);
      Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_50,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)other_00);
      IVar4 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(local_18);
      *(Index *)(this + 0x10) = IVar4 + *(long *)(this + 0x10);
      return (CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this;
    }
    __assert_fail("m_currentBlockRows==other.rows()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/CommaInitializer.h"
                  ,0x5d,
                  "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::operator,(const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  __assert_fail("(m_col + other.cols() <= m_xpr.cols()) && \"Too many coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/CommaInitializer.h"
                ,0x5c,
                "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::operator,(const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
  CommaInitializer& operator,(const DenseBase<OtherDerived>& other)
  {
    if (m_col==m_xpr.cols() && (other.cols()!=0 || other.rows()!=m_currentBlockRows))
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = other.rows();
      eigen_assert(m_row+m_currentBlockRows<=m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert((m_col + other.cols() <= m_xpr.cols())
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==other.rows());
    m_xpr.template block<OtherDerived::RowsAtCompileTime, OtherDerived::ColsAtCompileTime>
                    (m_row, m_col, other.rows(), other.cols()) = other;
    m_col += other.cols();
    return *this;
  }